

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# view.cpp
# Opt level: O0

double __thiscall r_exec::View::update_sln(View *this,double low,double high)

{
  Atom *this_00;
  float fVar1;
  double dVar2;
  float local_54;
  double sln;
  Atom local_2c [4];
  double local_28;
  double new_sln;
  double high_local;
  double low_local;
  View *this_local;
  
  new_sln = high;
  high_local = low;
  low_local = (double)this;
  if ((this->sln_changes != 0) && ((this->acc_sln != 0.0 || (NAN(this->acc_sln))))) {
    fVar1 = get_sln(this);
    local_54 = (float)this->sln_changes;
    local_28 = (double)(fVar1 + this->acc_sln / local_54);
    if (0.0 <= local_28) {
      if (1.0 < local_28) {
        local_28 = 1.0;
      }
    }
    else {
      local_28 = 0.0;
    }
    r_code::Atom::Float((float)local_28);
    this_00 = r_code::View::code(&this->super_View,3);
    r_code::Atom::operator=(this_00,local_2c);
    r_code::Atom::~Atom(local_2c);
  }
  this->acc_sln = 0.0;
  this->sln_changes = 0;
  fVar1 = get_sln(this);
  dVar2 = (double)fVar1;
  if (high_local <= dVar2) {
    this->periods_at_low_sln = 0;
    if (dVar2 <= new_sln) {
      this->periods_at_high_sln = 0;
    }
    else {
      this->periods_at_high_sln = this->periods_at_high_sln + 1;
    }
  }
  else {
    this->periods_at_low_sln = this->periods_at_low_sln + 1;
  }
  return dVar2;
}

Assistant:

double View::update_sln(double low, double high)
{
    if (sln_changes > 0 && acc_sln != 0) {
        double new_sln = get_sln() + acc_sln / sln_changes;

        if (new_sln < 0) {
            new_sln = 0;
        } else if (new_sln > 1) {
            new_sln = 1;
        }

        code(VIEW_SLN) = r_code::Atom::Float(new_sln);
    }

    acc_sln = 0;
    sln_changes = 0;
    double sln = get_sln();

    if (sln < low) {
        ++periods_at_low_sln;
    } else {
        periods_at_low_sln = 0;

        if (sln > high) {
            ++periods_at_high_sln;
        } else {
            periods_at_high_sln = 0;
        }
    }

    return sln;
}